

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

Span<int> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<int>
          (SmData *this,Span<int> *in,vector<int,_std::allocator<int>_> *out)

{
  Atom_t AVar1;
  pointer piVar2;
  iterator __position;
  pointer piVar3;
  Atom_t a;
  uint uVar4;
  undefined8 in_RAX;
  Atom *pAVar5;
  pointer piVar6;
  Atom_t *pAVar7;
  Span<int> SVar8;
  undefined8 uStack_38;
  
  piVar2 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar2) {
    (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar2;
  }
  if (in->size != 0) {
    pAVar7 = (Atom_t *)in->first;
    uStack_38 = in_RAX;
    do {
      AVar1 = *pAVar7;
      a = -AVar1;
      if (0 < (int)AVar1) {
        a = AVar1;
      }
      pAVar5 = mapAtom(this,a);
      uVar4 = -((uint)*pAVar5 & 0xfffffff);
      if (-1 < (int)AVar1) {
        uVar4 = (uint)*pAVar5 & 0xfffffff;
      }
      uStack_38 = CONCAT44(uVar4,(undefined4)uStack_38);
      __position._M_current =
           (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (out,__position,(int *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = uVar4;
        (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      pAVar7 = pAVar7 + 1;
    } while (pAVar7 != (Atom_t *)(in->first + in->size));
  }
  piVar2 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = (pointer)((long)piVar3 - (long)piVar2 >> 2);
  if (piVar3 == piVar2) {
    piVar6 = (pointer)0x0;
    piVar2 = (pointer)0x0;
  }
  SVar8.size = (size_t)piVar6;
  SVar8.first = piVar2;
  return SVar8;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}